

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpTokens.cpp
# Opt level: O1

int __thiscall glslang::TPpContext::tUngotTokenInput::scan(tUngotTokenInput *this,TPpToken *ppToken)

{
  int iVar1;
  
  iVar1 = -1;
  if ((this->super_tInput).done == false) {
    iVar1 = this->token;
    memcpy(ppToken,&this->lval,0x429);
    (this->super_tInput).done = true;
  }
  return iVar1;
}

Assistant:

int TPpContext::tUngotTokenInput::scan(TPpToken* ppToken)
{
    if (done)
        return EndOfInput;

    int ret = token;
    *ppToken = lval;
    done = true;

    return ret;
}